

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall embree::SceneGraph::GroupNode::grids_to_quads(GroupNode *this)

{
  pointer pRVar1;
  Node *pNVar2;
  ulong uVar3;
  Ref<embree::SceneGraph::Node> local_38;
  Node *local_30;
  
  uVar3 = 0;
  while( true ) {
    pRVar1 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->children).
                      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) <= uVar3)
    break;
    local_38.ptr = pRVar1[uVar3].ptr;
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_grids_to_quads((SceneGraph *)&local_30,&local_38);
    pRVar1 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = pRVar1[uVar3].ptr;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
    }
    pRVar1[uVar3].ptr = local_30;
    local_30 = (Node *)0x0;
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void grids_to_quads()
      {
        for (size_t i=0; i<children.size(); i++)
          children[i] = convert_grids_to_quads(children[i]);
      }